

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::Texture2DFilteringCase::init
          (Texture2DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  bool bVar1;
  deBool dVar2;
  int iVar3;
  int extraout_EAX;
  Archive *archive;
  size_type sVar4;
  Texture2D *pTVar5;
  TextureFormat *format;
  PixelBufferAccess *pPVar6;
  reference ppTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppTVar8;
  Texture2D *pTVar9;
  float fVar10;
  float local_298;
  bool local_285;
  Vector<float,_2> local_238;
  Vector<float,_2> local_230;
  FilterCase local_228;
  float local_210;
  float local_20c;
  float sY;
  float sX;
  float oY;
  float oX;
  float lodY;
  float lodX;
  int texNdx;
  int caseNdx;
  float viewportH;
  float viewportW;
  anon_struct_20_5_d494354b cases [4];
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_190;
  __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
  local_188;
  iterator i;
  Vector<float,_4> local_16c;
  Vec4 local_15c;
  RGBA local_14c;
  Vector<float,_4> local_148;
  Vector<float,_4> local_138;
  Vec4 local_128;
  uint local_118;
  uint local_114;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int levelNdx_1;
  Vector<float,_4> local_f4;
  undefined1 local_e4 [8];
  Vec4 gMax;
  Vector<float,_4> local_c4;
  undefined1 local_b4 [8];
  Vec4 gMin;
  int levelNdx;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  int numLevels;
  bool mipmaps;
  int local_2c;
  Texture2D *pTStack_28;
  int ndx;
  Texture2DFilteringCase *local_10;
  Texture2DFilteringCase *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_filenames);
  if (bVar1) {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(&this->m_textures,2);
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      pTVar5 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (pTVar5,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,
                 this->m_height);
      _numLevels = pTVar5;
      std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
                (&this->m_textures,(value_type *)&numLevels);
    }
    dVar2 = deIsPowerOfTwo32(this->m_width);
    local_285 = false;
    if (dVar2 != 0) {
      dVar2 = deIsPowerOfTwo32(this->m_height);
      local_285 = dVar2 != 0;
    }
    fmtInfo.lookupBias.m_data[3]._3_1_ = local_285;
    if (local_285 == false) {
      local_298 = 1.4013e-45;
    }
    else {
      iVar3 = de::max<int>(this->m_width,this->m_height);
      iVar3 = deLog2Floor32(iVar3);
      local_298 = (float)(iVar3 + 1);
    }
    fmtInfo.lookupBias.m_data[2] = local_298;
    ppTVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,0);
    pTVar9 = glu::Texture2D::getRefTexture(*ppTVar8);
    format = tcu::TextureLevelPyramid::getFormat(&pTVar9->super_TextureLevelPyramid);
    tcu::getTextureFormatInfo((TextureFormatInfo *)(cBias.m_data + 2),format);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)(cBias.m_data + 2));
    tcu::operator-((tcu *)(gMin.m_data + 3),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)(cBias.m_data + 2));
    for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < (int)fmtInfo.lookupBias.m_data[2];
        gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),-0.5,-0.5,-0.5,2.0);
      tcu::operator*((tcu *)&local_c4,(Vector<float,_4> *)(gMax.m_data + 2),
                     (Vector<float,_4> *)(gMin.m_data + 3));
      tcu::operator+((tcu *)local_b4,&local_c4,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&step,1.0,1.0,1.0,0.0);
      tcu::operator*((tcu *)&local_f4,(Vector<float,_4> *)&step,
                     (Vector<float,_4> *)(gMin.m_data + 3));
      tcu::operator+((tcu *)local_e4,&local_f4,(Vector<float,_4> *)(cScale.m_data + 2));
      ppTVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                          (&this->m_textures,0);
      pTVar9 = glu::Texture2D::getRefTexture(*ppTVar8);
      tcu::Texture2D::allocLevel(pTVar9,(int)gMin.m_data[2]);
      ppTVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                          (&this->m_textures,0);
      pTVar9 = glu::Texture2D::getRefTexture(*ppTVar8);
      pPVar6 = tcu::TextureLevelPyramid::getLevel
                         (&pTVar9->super_TextureLevelPyramid,(int)gMin.m_data[2]);
      tcu::fillWithComponentGradients(pPVar6,(Vec4 *)local_b4,(Vec4 *)local_e4);
    }
    for (rgb = 0; (int)rgb < (int)fmtInfo.lookupBias.m_data[2]; rgb = rgb + 1) {
      colorA = (deUint32)(0xffffff / (long)(int)fmtInfo.lookupBias.m_data[2]);
      colorB = colorA * rgb;
      local_114 = colorB | 0xff000000;
      local_118 = ~colorB | 0xff000000;
      ppTVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                          (&this->m_textures,1);
      pTVar9 = glu::Texture2D::getRefTexture(*ppTVar8);
      tcu::Texture2D::allocLevel(pTVar9,rgb);
      ppTVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                          (&this->m_textures,1);
      pTVar9 = glu::Texture2D::getRefTexture(*ppTVar8);
      pPVar6 = tcu::TextureLevelPyramid::getLevel(&pTVar9->super_TextureLevelPyramid,rgb);
      tcu::RGBA::RGBA(&local_14c,local_114);
      tcu::RGBA::toVec((RGBA *)&local_148);
      tcu::operator*((tcu *)&local_138,&local_148,(Vector<float,_4> *)(gMin.m_data + 3));
      tcu::operator+((tcu *)&local_128,&local_138,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::RGBA::RGBA((RGBA *)&i,local_118);
      tcu::RGBA::toVec((RGBA *)((long)&i._M_current + 4));
      tcu::operator*((tcu *)&local_16c,(Vector<float,_4> *)((long)&i._M_current + 4),
                     (Vector<float,_4> *)(gMin.m_data + 3));
      tcu::operator+((tcu *)&local_15c,&local_16c,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::fillWithGrid(pPVar6,4,&local_128,&local_15c);
    }
    local_188._M_current =
         (Texture2D **)
         std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::begin(&this->m_textures);
    while( true ) {
      local_190._M_current =
           (Texture2D **)
           std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::end(&this->m_textures);
      bVar1 = __gnu_cxx::operator!=(&local_188,&local_190);
      if (!bVar1) break;
      ppTVar7 = __gnu_cxx::
                __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
                ::operator*(&local_188);
      (*(*ppTVar7)->_vptr_Texture2D[2])();
      cases[3]._12_8_ =
           __gnu_cxx::
           __normal_iterator<glu::Texture2D_**,_std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>_>
           ::operator++(&local_188,0);
    }
  }
  else {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(&this->m_textures,1);
    context = this->m_renderCtx;
    contextInfo = this->m_renderCtxInfo;
    archive = tcu::TestContext::getArchive((this->super_TestCase).super_TestNode.m_testCtx);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_filenames);
    pTStack_28 = glu::Texture2D::create(context,contextInfo,archive,(int)sVar4,&this->m_filenames);
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
              (&this->m_textures,&stack0xffffffffffffffd8);
  }
  cases[2].oY = -0.92;
  cases[3].texNdx = -0x3fd70a3d;
  cases[3].lodX = 0.4;
  cases[3].lodY = -0.1;
  cases[2].texNdx = 0x3e8ccccd;
  cases[2].lodX = -1.5;
  cases[2].lodY = -1.1;
  cases[2].oX = 1.4013e-45;
  cases[1].lodX = -0.2;
  cases[1].lodY = 0.7;
  cases[1].oX = 1.4013e-45;
  cases[1].oY = 0.14;
  cases[0].lodY = -2.7;
  cases[0].oX = 0.0;
  cases[0].oY = -2.0;
  cases[1].texNdx = -0x40533333;
  viewportH = 0.0;
  viewportW = 1.6;
  cases[0].texNdx = 0x4039999a;
  cases[0].lodX = -1.0;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar3));
  iVar3 = de::min<int>(0x40,iVar3);
  caseNdx = (int)(float)iVar3;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar3));
  iVar3 = de::min<int>(0x40,iVar3);
  texNdx = (int)(float)iVar3;
  for (lodX = 0.0; (int)lodX < 4; lodX = (float)((int)lodX + 1)) {
    fVar10 = (&viewportH)[(long)(int)lodX * 5];
    sVar4 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::size
                      (&this->m_textures);
    lodY = (float)de::clamp<int>((int)fVar10,0,(int)sVar4 + -1);
    oX = cases[(long)(int)lodX + -1].oY;
    oY = (float)cases[(int)lodX].texNdx;
    sX = cases[(int)lodX].lodX;
    sY = cases[(int)lodX].lodY;
    fVar10 = deFloatExp2(oX);
    fVar10 = fVar10 * (float)caseNdx;
    ppTVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)(int)lodY);
    pTVar9 = glu::Texture2D::getRefTexture(*ppTVar8);
    iVar3 = tcu::Texture2D::getWidth(pTVar9);
    local_20c = fVar10 / (float)iVar3;
    fVar10 = deFloatExp2(oY);
    fVar10 = fVar10 * (float)texNdx;
    ppTVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)(int)lodY);
    pTVar9 = glu::Texture2D::getRefTexture(*ppTVar8);
    iVar3 = tcu::Texture2D::getHeight(pTVar9);
    local_210 = fVar10 / (float)iVar3;
    ppTVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)(int)lodY);
    pTVar5 = *ppTVar8;
    tcu::Vector<float,_2>::Vector(&local_230,sX,sY);
    tcu::Vector<float,_2>::Vector(&local_238,sX + local_20c,sY + local_210);
    FilterCase::FilterCase(&local_228,pTVar5,&local_230,&local_238);
    std::
    vector<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_228);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DFilteringCase::init (void)
{
	try
	{
		if (!m_filenames.empty())
		{
			m_textures.reserve(1);
			m_textures.push_back(glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames));
		}
		else
		{
			// Create 2 textures.
			m_textures.reserve(2);
			for (int ndx = 0; ndx < 2; ndx++)
				m_textures.push_back(new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height));

			bool					mipmaps		= deIsPowerOfTwo32(m_width) && deIsPowerOfTwo32(m_height);
			int						numLevels	= mipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
			tcu::Vec4				cBias		= fmtInfo.valueMin;
			tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill first gradient texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				tcu::Vec4 gMin = tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
				tcu::Vec4 gMax = tcu::Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

				m_textures[0]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
			}

			// Fill second with grid texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / numLevels;
				deUint32	rgb		= step*levelNdx;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}

			// Upload.
			for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
				(*i)->upload();
		}

		// Compute cases.
		{
			const struct
			{
				int		texNdx;
				float	lodX;
				float	lodY;
				float	oX;
				float	oY;
			} cases[] =
			{
				{ 0,	1.6f,	2.9f,	-1.0f,	-2.7f	},
				{ 0,	-2.0f,	-1.35f,	-0.2f,	0.7f	},
				{ 1,	0.14f,	0.275f,	-1.5f,	-1.1f	},
				{ 1,	-0.92f,	-2.64f,	0.4f,	-0.1f	},
			};

			const float	viewportW	= (float)de::min<int>(VIEWPORT_WIDTH, m_renderCtx.getRenderTarget().getWidth());
			const float	viewportH	= (float)de::min<int>(VIEWPORT_HEIGHT, m_renderCtx.getRenderTarget().getHeight());

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int	texNdx	= de::clamp(cases[caseNdx].texNdx, 0, (int)m_textures.size()-1);
				const float	lodX	= cases[caseNdx].lodX;
				const float	lodY	= cases[caseNdx].lodY;
				const float	oX		= cases[caseNdx].oX;
				const float	oY		= cases[caseNdx].oY;
				const float	sX		= deFloatExp2(lodX)*viewportW / float(m_textures[texNdx]->getRefTexture().getWidth());
				const float	sY		= deFloatExp2(lodY)*viewportH / float(m_textures[texNdx]->getRefTexture().getHeight());

				m_cases.push_back(FilterCase(m_textures[texNdx], tcu::Vec2(oX, oY), tcu::Vec2(oX+sX, oY+sY)));
			}
		}

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DFilteringCase::deinit();
		throw;
	}
}